

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteFieldEnumValueAccessorDocComment
               (Printer *printer,FieldDescriptor *field,FieldAccessorType type,bool builder)

{
  byte in_CL;
  undefined4 in_EDX;
  FieldDescriptor *in_RSI;
  string *in_RDI;
  FieldDescriptor *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  Printer *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  Printer *in_stack_ffffffffffffff90;
  FieldDescriptor *in_stack_ffffffffffffffa8;
  Printer *in_stack_ffffffffffffffb0;
  string local_38 [35];
  byte local_15;
  undefined4 local_14;
  FieldDescriptor *local_10;
  string *local_8;
  
  local_15 = in_CL & 1;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  io::Printer::Print<>(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
  WriteDocCommentBody<google::protobuf::FieldDescriptor>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  FieldDescriptor::DebugString_abi_cxx11_(in_stack_ffffffffffffff48);
  FirstLineOf(in_stack_ffffffffffffff58);
  EscapeJavadoc(local_8);
  io::Printer::Print<char[4],std::__cxx11::string>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             &in_stack_ffffffffffffff80->variable_delimiter_,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  switch(local_14) {
  case 0:
    break;
  case 1:
    FieldDescriptor::camelcase_name_abi_cxx11_(local_10);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               &in_stack_ffffffffffffff80->variable_delimiter_,in_stack_ffffffffffffff78);
    break;
  case 2:
    FieldDescriptor::camelcase_name_abi_cxx11_(local_10);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               &in_stack_ffffffffffffff80->variable_delimiter_,in_stack_ffffffffffffff78);
    break;
  case 3:
    break;
  case 4:
    break;
  case 5:
    FieldDescriptor::camelcase_name_abi_cxx11_(local_10);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               &in_stack_ffffffffffffff80->variable_delimiter_,in_stack_ffffffffffffff78);
    break;
  case 6:
    io::Printer::Print<>(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
    FieldDescriptor::camelcase_name_abi_cxx11_(local_10);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               &in_stack_ffffffffffffff80->variable_delimiter_,in_stack_ffffffffffffff78);
    break;
  case 7:
    io::Printer::Print<>(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
    FieldDescriptor::camelcase_name_abi_cxx11_(local_10);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               &in_stack_ffffffffffffff80->variable_delimiter_,in_stack_ffffffffffffff78);
    break;
  case 8:
    FieldDescriptor::camelcase_name_abi_cxx11_(local_10);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               &in_stack_ffffffffffffff80->variable_delimiter_,in_stack_ffffffffffffff78);
    break;
  case 9:
    FieldDescriptor::camelcase_name_abi_cxx11_(local_10);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               &in_stack_ffffffffffffff80->variable_delimiter_,in_stack_ffffffffffffff78);
  }
  if ((local_15 & 1) != 0) {
    io::Printer::Print<>(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
  }
  io::Printer::Print<>(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
  return;
}

Assistant:

void WriteFieldEnumValueAccessorDocComment(io::Printer* printer,
                                           const FieldDescriptor* field,
                                           const FieldAccessorType type,
                                           const bool builder) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, field);
  printer->Print(" * <code>$def$</code>\n", "def",
                 EscapeJavadoc(FirstLineOf(field->DebugString())));
  switch (type) {
    case HAZZER:
      // Should never happen
      break;
    case GETTER:
      printer->Print(
          " * @return The enum numeric value on the wire for $name$.\n", "name",
          field->camelcase_name());
      break;
    case SETTER:
      printer->Print(
          " * @param value The enum numeric value on the wire for $name$ to "
          "set.\n",
          "name", field->camelcase_name());
      break;
    case CLEARER:
      // Print nothing
      break;
    // Repeated
    case LIST_COUNT:
      // Should never happen
      break;
    case LIST_GETTER:
      printer->Print(
          " * @return A list containing the enum numeric values on the wire "
          "for $name$.\n",
          "name", field->camelcase_name());
      break;
    case LIST_INDEXED_GETTER:
      printer->Print(" * @param index The index of the value to return.\n");
      printer->Print(
          " * @return The enum numeric value on the wire of $name$ at the "
          "given index.\n",
          "name", field->camelcase_name());
      break;
    case LIST_INDEXED_SETTER:
      printer->Print(" * @param index The index to set the value at.\n");
      printer->Print(
          " * @param value The enum numeric value on the wire for $name$ to "
          "set.\n",
          "name", field->camelcase_name());
      break;
    case LIST_ADDER:
      printer->Print(
          " * @param value The enum numeric value on the wire for $name$ to "
          "add.\n",
          "name", field->camelcase_name());
      break;
    case LIST_MULTI_ADDER:
      printer->Print(
          " * @param values The enum numeric values on the wire for $name$ to "
          "add.\n",
          "name", field->camelcase_name());
      break;
  }
  if (builder) {
    printer->Print(" * @return This builder for chaining.\n");
  }
  printer->Print(" */\n");
}